

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int sx_hashtbltval_find(sx_hashtbl_tval *tbl,uint32_t key)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint32_t i;
  uint uVar5;
  ulong uVar4;
  
  bVar1 = (byte)tbl->_bitshift;
  uVar4 = (ulong)(key >> (bVar1 & 0x3f) ^ key) * -0x61c8864680b583eb >> (bVar1 & 0x3f);
  uVar3 = (uint)uVar4;
  uVar2 = uVar3;
  if (tbl->keys[uVar4 & 0xffffffff] != key) {
    tbl->_miss_cnt = tbl->_miss_cnt + 1;
    uVar5 = 1;
    do {
      if ((uint)tbl->capacity <= uVar5) {
        return -1;
      }
      uVar2 = (uVar3 + uVar5) % (uint)tbl->capacity;
      tbl->_probe_cnt = tbl->_probe_cnt + 1;
      uVar5 = uVar5 + 1;
    } while (tbl->keys[(int)uVar2] != key);
  }
  return uVar2;
}

Assistant:

int sx_hashtbltval_find(const sx_hashtbl_tval* tbl, uint32_t key)
{
    uint32_t h = sx__fib_hash(key, tbl->_bitshift);
    uint32_t cnt = (uint32_t)tbl->capacity;
    if (tbl->keys[h] == key) {
        return h;
    } else {
#if SX_CONFIG_HASHTBL_DEBUG
        sx_hashtbl_tval* _tbl = (sx_hashtbl_tval*)tbl;
        ++_tbl->_miss_cnt;
#endif
        // probe lineary in the keys array
        for (uint32_t i = 1; i < cnt; i++) {
            int idx = (h + i) % cnt;
#if SX_CONFIG_HASHTBL_DEBUG
            ++_tbl->_probe_cnt;
#endif
            if (tbl->keys[idx] == key)
                return idx;
        }

        return -1;    // Worst case: Not found!
    }
}